

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

ssize_t read_stream(archive_read *a,void **buff,size_t size,size_t minimum)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  ssize_t sVar5;
  size_t size_00;
  ssize_t unaff_RBP;
  
  pvVar2 = a->format->data;
  if (*(long *)((long)pvVar2 + 0xf0) != 0) {
LAB_0015c519:
    sVar5 = get_uncompressed_data(a,buff,size,minimum);
    return sVar5;
  }
  if ((*(long *)((long)pvVar2 + 0x118) != 0) || (*(long *)((long)pvVar2 + 0x108) != 0)) {
    sVar5 = extract_pack_stream(a,0);
    if (sVar5 < 0) {
      return sVar5;
    }
    goto LAB_0015c519;
  }
  if (*(int *)((long)pvVar2 + 0x114) != 0) {
    size_00 = 0;
    goto LAB_0015c540;
  }
  if (*(int *)((long)pvVar2 + 0x68) != 0) {
    archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
    return -0x1e;
  }
  if (*(int *)((long)pvVar2 + 0x100) == 0) {
    uVar1 = *(uint *)(*(long *)((long)pvVar2 + 0xa8) + 0x10);
    size_00 = *(size_t *)(*(long *)((long)pvVar2 + 0x38) + 0x60 + (ulong)uVar1 * 0x68);
    if ((ulong)uVar1 == 0 && size_00 == 0) goto LAB_0015c662;
    *(uint *)((long)pvVar2 + 0x100) = uVar1;
  }
  else {
LAB_0015c662:
    size_00 = 0;
  }
  if (*(ulong *)((long)pvVar2 + 0x30) <= (ulong)*(uint *)((long)pvVar2 + 0x100)) {
    *buff = (void *)0x0;
    return 0;
  }
  iVar4 = setup_decode_folder(a,(_7z_folder *)
                                ((ulong)*(uint *)((long)pvVar2 + 0x100) * 0x68 +
                                *(long *)((long)pvVar2 + 0x38)),0);
  unaff_RBP = -0x1e;
  if (iVar4 != 0) {
    return -0x1e;
  }
  *(int *)((long)pvVar2 + 0x100) = *(int *)((long)pvVar2 + 0x100) + 1;
LAB_0015c540:
  iVar4 = seek_pack(a);
  if (iVar4 < 0) {
    sVar5 = (ssize_t)iVar4;
  }
  else {
    sVar5 = extract_pack_stream(a,0);
    if (-1 < sVar5) {
      do {
        if (size_00 == 0) goto LAB_0015c519;
        if (*(long *)((long)pvVar2 + 0xf0) == 0) {
          if ((*(long *)((long)pvVar2 + 0x118) != 0) || (*(long *)((long)pvVar2 + 0x108) != 0)) {
            sVar5 = extract_pack_stream(a,0);
            if (-1 < sVar5) goto LAB_0015c599;
            goto LAB_0015c5c9;
          }
          archive_set_error(&a->archive,0x54,"Truncated 7-Zip file body");
          bVar3 = false;
          sVar5 = -0x1e;
        }
        else {
LAB_0015c599:
          sVar5 = get_uncompressed_data(a,buff,size_00,0);
          if (sVar5 < 0) {
LAB_0015c5c9:
            bVar3 = false;
          }
          else {
            size_00 = size_00 - sVar5;
            bVar3 = true;
            sVar5 = unaff_RBP;
            if (*(long *)((long)pvVar2 + 0x120) != 0) {
              read_consume(a);
              bVar3 = true;
            }
          }
        }
        unaff_RBP = sVar5;
      } while (bVar3);
    }
  }
  return sVar5;
}

Assistant:

static ssize_t
read_stream(struct archive_read *a, const void **buff, size_t size,
    size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	uint64_t skip_bytes = 0;
	ssize_t r;

	if (zip->uncompressed_buffer_bytes_remaining == 0) {
		if (zip->pack_stream_inbytes_remaining > 0) {
			r = extract_pack_stream(a, 0);
			if (r < 0)
				return (r);
			return (get_uncompressed_data(a, buff, size, minimum));
		} else if (zip->folder_outbytes_remaining > 0) {
			/* Extract a remaining pack stream. */
			r = extract_pack_stream(a, 0);
			if (r < 0)
				return (r);
			return (get_uncompressed_data(a, buff, size, minimum));
		}
	} else
		return (get_uncompressed_data(a, buff, size, minimum));

	/*
	 * Current pack stream has been consumed.
	 */
	if (zip->pack_stream_remaining == 0) {
		if (zip->header_is_being_read) {
			/* Invalid sequence. This might happen when
			 * reading a malformed archive. */
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Malformed 7-Zip archive");
			return (ARCHIVE_FATAL);
		}

		/*
		 * All current folder's pack streams have been
		 * consumed. Switch to next folder.
		 */
		if (zip->folder_index == 0 &&
		    (zip->si.ci.folders[zip->entry->folderIndex].skipped_bytes
		     || zip->folder_index != zip->entry->folderIndex)) {
			zip->folder_index = zip->entry->folderIndex;
			skip_bytes =
			    zip->si.ci.folders[zip->folder_index].skipped_bytes;
		}

		if (zip->folder_index >= zip->si.ci.numFolders) {
			/*
			 * We have consumed all folders and its pack streams.
			 */
			*buff = NULL;
			return (0);
		}
		r = setup_decode_folder(a,
			&(zip->si.ci.folders[zip->folder_index]), 0);
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);

		zip->folder_index++;
	}

	/*
	 * Switch to next pack stream.
	 */
	r = seek_pack(a);
	if (r < 0)
		return (r);

	/* Extract a new pack stream. */
	r = extract_pack_stream(a, 0);
	if (r < 0)
		return (r);

	/*
	 * Skip the bytes we alrady has skipped in skip_stream().
	 */
	while (skip_bytes) {
		ssize_t skipped;

		if (zip->uncompressed_buffer_bytes_remaining == 0) {
			if (zip->pack_stream_inbytes_remaining > 0) {
				r = extract_pack_stream(a, 0);
				if (r < 0)
					return (r);
			} else if (zip->folder_outbytes_remaining > 0) {
				/* Extract a remaining pack stream. */
				r = extract_pack_stream(a, 0);
				if (r < 0)
					return (r);
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated 7-Zip file body");
				return (ARCHIVE_FATAL);
			}
		}
		skipped = get_uncompressed_data(
			a, buff, (size_t)skip_bytes, 0);
		if (skipped < 0)
			return (skipped);
		skip_bytes -= skipped;
		if (zip->pack_stream_bytes_unconsumed)
			read_consume(a);
	}

	return (get_uncompressed_data(a, buff, size, minimum));
}